

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadThings(MapData *map)

{
  short sVar1;
  FileReader *pFVar2;
  ushort uVar3;
  WORD WVar4;
  uint uVar5;
  void *buffer;
  FDoomEdEntry *pFVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  FMapThing *mt;
  ushort uVar11;
  undefined1 auVar12 [16];
  
  pFVar2 = map->MapLumps[1].Reader;
  uVar10 = 0;
  if (pFVar2 == (FileReader *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ulong)(int)pFVar2->Length;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar9;
  buffer = operator_new__(uVar9);
  MapData::Read(map,1,buffer,-1);
  uVar8 = SUB164(auVar12 / ZEXT816(10),0);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,uVar8);
  uVar9 = SUB168(auVar12 / ZEXT816(10),0) & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar10;
  }
  mt = MapThingsConverted.Array;
  do {
    if (uVar9 * 10 - uVar10 == 0) {
      operator_delete__(buffer);
      return;
    }
    uVar11 = *(ushort *)((long)buffer + uVar10 + 8);
    uVar8 = (uint)(short)uVar11;
    memset(mt,0,0x90);
    WVar4 = MakeSkill(uVar8);
    mt->SkillFilter = WVar4;
    mt->ClassFilter = 0xffff;
    mt->RenderStyle = 0xe;
    mt->FloatbobPhase = -1;
    mt->Gravity = 1.0;
    mt->Alpha = -1.0;
    mt->health = 1;
    auVar12 = pshuflw(ZEXT416(*(uint *)((long)buffer + uVar10)),
                      ZEXT416(*(uint *)((long)buffer + uVar10)),0x60);
    (mt->pos).X = (double)(auVar12._0_4_ >> 0x10);
    (mt->pos).Y = (double)(auVar12._4_4_ >> 0x10);
    mt->angle = *(short *)((long)buffer + uVar10 + 4);
    sVar1 = *(short *)((long)buffer + uVar10 + 6);
    mt->EdNum = sVar1;
    pFVar6 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)sVar1);
    mt->info = pFVar6;
    if ((pFVar6 == (FDoomEdEntry *)0x0) || (pFVar6->Special != 0x19)) {
      uVar5 = (uint)uVar11;
      uVar7 = uVar5 & 8 | 0x7e0;
      mt->flags = uVar7;
      if (gameinfo.gametype == GAME_Strife) {
        uVar5 = (uVar8 >> 2 & 8) + ((uVar8 & 8) << 0xb | (uVar8 & 0x200) * 8 + (uVar8 & 0x100) * 8)
                + 0x7e0;
        mt->flags = uVar5;
        if ((uVar8 & 0x40) != 0) {
          uVar5 = uVar5 | 0x2000;
LAB_00446c5c:
          mt->flags = uVar5;
        }
      }
      else {
        uVar3 = uVar11 & 0x18;
        if ((uVar8 >> 8 & 1) == 0) {
          uVar3 = uVar11;
        }
        uVar11 = uVar3;
        uVar8 = uVar5 & 8 | 0x3e0;
        if ((uVar11 & 0x20) == 0) {
          uVar8 = uVar7;
        }
        uVar5 = uVar8 & 0x5e8;
        if ((uVar11 & 0x40) == 0) {
          uVar5 = uVar8;
        }
        uVar5 = (uVar11 & 0x80) << 6 | uVar5;
        if ((uVar11 & 0xe0) != 0) goto LAB_00446c5c;
      }
      if ((uVar11 & 0x10) != 0) {
        mt->flags = uVar5 & 0x7eff;
      }
    }
    else {
      ProcessEDMapthing(mt,uVar8);
    }
    uVar10 = uVar10 + 10;
    mt = mt + 1;
  } while( true );
}

Assistant:

void P_LoadThings (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthing_t);

	char *mtp;
	mapthing_t *mt;

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mt = (mapthing_t*)mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	// [RH] ZDoom now uses Hexen-style maps as its native format.
	//		Since this is the only place where Doom-style Things are ever
	//		referenced, we translate them into a Hexen-style thing.
	for (int i=0 ; i < numthings; i++, mt++)
	{
		// [RH] At this point, monsters unique to Doom II were weeded out
		//		if the IWAD wasn't for Doom II. P_SpawnMapThing() can now
		//		handle these and more cases better, so we just pass it
		//		everything and let it decide what to do with them.

		// [RH] Need to translate the spawn flags to Hexen format.
		short flags = LittleShort(mt->options);

		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].Gravity = 1;
		mti[i].Conversation = 0;
		mti[i].SkillFilter = MakeSkill(flags);
		mti[i].ClassFilter = 0xffff;	// Doom map format doesn't have class flags so spawn for all player classes
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;

		mti[i].pos.X = LittleShort(mt->x);
		mti[i].pos.Y = LittleShort(mt->y);
		mti[i].angle = LittleShort(mt->angle);
		mti[i].EdNum = LittleShort(mt->type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);


#ifndef NO_EDATA
		if (mti[i].info != NULL && mti[i].info->Special == SMT_EDThing)
		{
			ProcessEDMapthing(&mti[i], flags);
		}
		else
#endif
		{
			flags &= ~MTF_SKILLMASK;
			mti[i].flags = (short)((flags & 0xf) | 0x7e0);
			if (gameinfo.gametype == GAME_Strife)
			{
				mti[i].flags &= ~MTF_AMBUSH;
				if (flags & STF_SHADOW)			mti[i].flags |= MTF_SHADOW;
				if (flags & STF_ALTSHADOW)		mti[i].flags |= MTF_ALTSHADOW;
				if (flags & STF_STANDSTILL)		mti[i].flags |= MTF_STANDSTILL;
				if (flags & STF_AMBUSH)			mti[i].flags |= MTF_AMBUSH;
				if (flags & STF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			else
			{
				if (flags & BTF_BADEDITORCHECK)
				{
					flags &= 0x1F;
				}
				if (flags & BTF_NOTDEATHMATCH)	mti[i].flags &= ~MTF_DEATHMATCH;
				if (flags & BTF_NOTCOOPERATIVE)	mti[i].flags &= ~MTF_COOPERATIVE;
				if (flags & BTF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			if (flags & BTF_NOTSINGLE)			mti[i].flags &= ~MTF_SINGLE;
		}
	}
	delete [] mtp;
}